

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic_annotations.cc
# Opt level: O3

int RunningOnValgrind(void)

{
  char *pcVar1;
  
  if (RunningOnValgrind::running_on_valgrind != -1) {
    return RunningOnValgrind::running_on_valgrind;
  }
  pcVar1 = getenv("RUNNING_ON_VALGRIND");
  if (pcVar1 == (char *)0x0) {
    RunningOnValgrind::running_on_valgrind = 0;
  }
  else {
    RunningOnValgrind::running_on_valgrind = 1;
    if (*pcVar1 == '0') {
      RunningOnValgrind::running_on_valgrind = (int)(pcVar1[1] != '\0');
    }
  }
  return RunningOnValgrind::running_on_valgrind;
}

Assistant:

int RunningOnValgrind(void) {
  static volatile int running_on_valgrind = -1;
  int local_running_on_valgrind = running_on_valgrind;
  /* C doesn't have thread-safe initialization of statics, and we
     don't want to depend on pthread_once here, so hack it. */
  ANNOTATE_BENIGN_RACE(&running_on_valgrind, "safe hack");
  if (local_running_on_valgrind == -1)
    running_on_valgrind = local_running_on_valgrind = GetRunningOnValgrind();
  return local_running_on_valgrind;
}